

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O3

void __thiscall
UnifiedRegex::CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::Inner::Set
          (Inner *this,ArenaAllocator *allocator,int defv,int level,uint k,int v)

{
  int *piVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Node *pNVar5;
  undefined **ppuVar6;
  long lVar7;
  int iVar8;
  undefined4 in_register_00000014;
  ulong uVar9;
  undefined4 in_register_0000008c;
  ulong uVar10;
  uint uVar11;
  
  uVar10 = CONCAT44(in_register_0000008c,v);
  uVar9 = CONCAT44(in_register_00000014,defv);
  if (level < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharMap.h"
                       ,0xb6,"(level > 0)","level > 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    uVar10 = (ulong)(uint)v;
    uVar9 = (ulong)(uint)defv;
  }
  uVar11 = k >> ((byte)(level << 2) & 0x1f) & 0xf;
  pNVar5 = this->children[uVar11];
  if (pNVar5 == (Node *)0x0) {
    iVar8 = (int)uVar9;
    if ((int)uVar10 == iVar8) {
      return;
    }
    uVar9 = uVar9 & 0xffffffff;
    if (level - 1U == 0) {
      pNVar5 = (Node *)new<Memory::ArenaAllocator>(0x48,allocator,0x364470);
      ppuVar6 = &PTR_FreeSelf_01543678;
      pNVar5->_vptr_Node = (_func_int **)&PTR_FreeSelf_01543678;
      lVar7 = 2;
      do {
        piVar1 = (int *)((long)&pNVar5->_vptr_Node + lVar7 * 4);
        *piVar1 = iVar8;
        piVar1[1] = iVar8;
        piVar1[2] = iVar8;
        piVar1[3] = iVar8;
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0x12);
    }
    else {
      pNVar5 = (Node *)new<Memory::ArenaAllocator>(0x88,allocator,0x364470);
      ppuVar6 = &PTR_FreeSelf_01543638;
      pNVar5->_vptr_Node = (_func_int **)&PTR_FreeSelf_01543638;
      *(undefined1 (*) [16])(pNVar5 + 1) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(pNVar5 + 3) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(pNVar5 + 5) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(pNVar5 + 7) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(pNVar5 + 9) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(pNVar5 + 0xb) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(pNVar5 + 0xd) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(pNVar5 + 0xf) = (undefined1  [16])0x0;
    }
    uVar10 = uVar10 & 0xffffffff;
    this->children[uVar11] = pNVar5;
  }
  else {
    ppuVar6 = pNVar5->_vptr_Node;
  }
  (*((_func_int **)ppuVar6)[1])(pNVar5,allocator,uVar9,(ulong)(level - 1U),(ulong)k,uVar10);
  return;
}

Assistant:

void Set(ArenaAllocator* allocator, V defv, int level, uint k, V v) override
            {
                Assert(level > 0);
                uint i = innerIdx(level--, k);
                if (children[i] == 0)
                {
                    if (v == defv)
                        return;
                    children[i] = Node::For(allocator, level, defv);
                }
                children[i]->Set(allocator, defv, level, k, v);
            }